

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void print_out(string *_str,int _x,int _y)

{
  pointer pbVar1;
  pointer pbVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  size_t i;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  
  uVar6 = 0;
  vera::split(&lines,_str,'\n',false);
  if (out_win == (WINDOW *)0x0) {
    uVar9 = 0xfffffffffffffffd;
  }
  else {
    uVar9 = (long)out_win->_maxy - 1;
  }
  uVar3 = (long)lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  uVar4 = uVar3 - uVar9;
  iVar8 = 0;
  if (uVar9 <= uVar3 && uVar4 != 0) {
    iVar8 = (int)uVar4;
  }
  if (0 < out_offset_line) {
    uVar6 = (ulong)(uint)out_offset_line;
  }
  uVar3 = uVar6;
  if (uVar4 <= uVar6) {
    uVar3 = uVar4 & 0xffffffff;
  }
  if ((out_offset_line < 0) || (uVar4 <= uVar6)) {
    out_offset_line = (int)uVar3;
  }
  uVar5 = iVar8 - (int)uVar3;
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  uVar6 = (ulong)uVar5;
  lVar7 = uVar6 << 5;
  iVar8 = 0;
  pbVar1 = lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (; uVar6 < (ulong)((long)pbVar2 - (long)pbVar1 >> 5); uVar6 = uVar6 + 1) {
    if ((ulong)(long)iVar8 < uVar9) {
      mvwprintw(out_win,iVar8 + _y,_x,"%s",
                *(undefined8 *)((long)&(pbVar1->_M_dataplus)._M_p + lVar7));
      iVar8 = iVar8 + 1;
      pbVar1 = lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    lVar7 = lVar7 + 0x20;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lines);
  return;
}

Assistant:

void print_out(const std::string& _str, int _x, int _y) {
    std::vector<std::string> lines = vera::split(_str, '\n');
    size_t total_lines, total_cols;
    getmaxyx(out_win, total_lines, total_cols);
    total_lines -= 2;

    int line_n = 0;

    if (lines.size() > total_lines)
        line_n = lines.size() - total_lines;
    
    if (out_offset_line < 0)
        out_offset_line = 0;

    if (out_offset_line >= lines.size()-total_lines)
        out_offset_line = lines.size()-total_lines;

    line_n -= out_offset_line;
    if (line_n < 0)
        line_n = 0;

    int y = 0;
    for (size_t i = line_n; i < lines.size(); i++) {
        if (y < total_lines)
            mvwprintw(out_win, _y + y++, _x, "%s", lines[i].c_str() );
    }
}